

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_dapi.cpp
# Opt level: O2

void tqapi_dapi_free_get_bars_result(DataApi *dapi,GetBarResult *result)

{
  CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_> *this;
  
  if (result != (GetBarResult *)0x0) {
    this = &result->data->result;
    if (this != (CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_> *)0x0) {
      tquant::api::CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_>::~CallResult
                (this);
    }
    operator_delete(this);
    operator_delete(result);
    return;
  }
  return;
}

Assistant:

void tqapi_dapi_free_get_bars_result(DataApi* dapi, GetBarResult* result)
    {
        if (result) {
            delete result->data;
            delete result;
        }
    }